

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef llvm::AArch64::getDefaultCPU(StringRef Arch)

{
  ArchKind AVar1;
  size_t in_RDX;
  StringRef SVar2;
  CpuNames<llvm::AArch64::ArchKind> *CPU;
  CpuNames<llvm::AArch64::ArchKind> *__end1;
  CpuNames<llvm::AArch64::ArchKind> *__begin1;
  CpuNames<llvm::AArch64::ArchKind> (*__range1) [21];
  ArchKind AK;
  StringRef Arch_local;
  
  SVar2.Data = (char *)Arch.Length;
  SVar2.Length = in_RDX;
  Arch_local.Data = SVar2.Data;
  AVar1 = parseArch((AArch64 *)Arch.Data,SVar2);
  if (AVar1 == INVALID) {
    memset(&Arch_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Arch_local.Length);
  }
  else {
    for (__end1 = (CpuNames<llvm::AArch64::ArchKind> *)&(anonymous_namespace)::AArch64CPUNames;
        __end1 != (CpuNames<llvm::AArch64::ArchKind> *)&completed_0; __end1 = __end1 + 1) {
      if ((__end1->ArchID == AVar1) && ((__end1->Default & 1U) != 0)) {
        SVar2 = anon_unknown.dwarf_3ff1be::CpuNames<llvm::AArch64::ArchKind>::getName(__end1);
        return SVar2;
      }
    }
    strlen("generic");
  }
  return stack0xffffffffffffffd8;
}

Assistant:

StringRef llvm::AArch64::getDefaultCPU(StringRef Arch) {
  AArch64::ArchKind AK = parseArch(Arch);
  if (AK == ArchKind::INVALID)
    return StringRef();

  // Look for multiple AKs to find the default for pair AK+Name.
  for (const auto &CPU : AArch64CPUNames)
    if (CPU.ArchID == AK && CPU.Default)
      return CPU.getName();

  // If we can't find a default then target the architecture instead
  return "generic";
}